

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccs_test.cpp
# Opt level: O0

void __thiscall CcsTest_Graphviz_Test::~CcsTest_Graphviz_Test(CcsTest_Graphviz_Test *this)

{
  CcsTest_Graphviz_Test *this_local;
  
  ~CcsTest_Graphviz_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CcsTest, Graphviz) {
  CcsDomain ccs(std::make_shared<FailingLogger>());
  ccs.ruleBuilder()
    .select("a").select("b").set("p1", "1").pop()
    .select("b").set("p2", "2");

  std::ostringstream out;
  ccs.logRuleDag(out);

  // TODO is there anything useful that can be done here? the graph
  // itself is probably dependent on the hash order of pointers and thus
  // nondeterministic... here's something dumb w can verify...
  EXPECT_NE(std::string::npos, out.str().find("p1 = 1"));
  EXPECT_NE(std::string::npos, out.str().find("p2 = 2"));
}